

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interaction.h
# Opt level: O1

void __thiscall
pbrt::SurfaceInteraction::SetShadingGeometry
          (SurfaceInteraction *this,Normal3f ns,Vector3f dpdus,Vector3f dpdvs,Normal3f dndus,
          Normal3f dndvs,bool orientationIsAuthoritative)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  ulong uVar5;
  ulong uVar6;
  undefined4 uVar7;
  undefined1 auVar8 [16];
  bool bVar9;
  undefined3 in_register_00000031;
  undefined1 auVar10 [64];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [64];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [64];
  undefined1 auVar18 [16];
  undefined1 auVar19 [64];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  
  auVar19._8_56_ = dndus._8_56_;
  auVar19._0_8_ = dndus.super_Tuple3<pbrt::Normal3,_float>._0_8_;
  auVar17._8_56_ = dpdvs._8_56_;
  auVar17._0_8_ = dpdvs.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar14._8_56_ = dpdus._8_56_;
  auVar14._0_8_ = dpdus.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar10._8_56_ = ns._8_56_;
  auVar10._0_8_ = ns.super_Tuple3<pbrt::Normal3,_float>._0_8_;
  uVar4 = vmovlps_avx(auVar10._0_16_);
  (this->shading).n.super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)uVar4;
  (this->shading).n.super_Tuple3<pbrt::Normal3,_float>.y = (float)(int)((ulong)uVar4 >> 0x20);
  (this->shading).n.super_Tuple3<pbrt::Normal3,_float>.z = ns.super_Tuple3<pbrt::Normal3,_float>.z;
  if (CONCAT31(in_register_00000031,orientationIsAuthoritative) == 0) {
    uVar6._0_4_ = (this->shading).n.super_Tuple3<pbrt::Normal3,_float>.x;
    uVar6._4_4_ = (this->shading).n.super_Tuple3<pbrt::Normal3,_float>.y;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = uVar6;
    fVar1 = (this->shading).n.super_Tuple3<pbrt::Normal3,_float>.z;
    fVar2 = (this->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.z;
    auVar8 = vmovshdup_avx(auVar12);
    auVar20 = ZEXT416((uint)(fVar2 * fVar1));
    auVar8 = vfmadd132ss_fma(auVar8,auVar20,
                             ZEXT416((uint)(this->super_Interaction).n.
                                           super_Tuple3<pbrt::Normal3,_float>.y));
    auVar20 = vfmsub213ss_fma(ZEXT416((uint)fVar2),ZEXT416((uint)fVar1),auVar20);
    auVar8 = vfmadd132ss_fma(auVar12,ZEXT416((uint)(auVar8._0_4_ + auVar20._0_4_)),
                             ZEXT416((uint)(this->super_Interaction).n.
                                           super_Tuple3<pbrt::Normal3,_float>.x));
    auVar20._0_12_ = ZEXT812(0);
    auVar20._12_4_ = 0;
    if (auVar8._0_4_ < 0.0) {
      auVar12._0_8_ = uVar6 ^ 0x8000000080000000;
      auVar12._8_4_ = 0x80000000;
      auVar12._12_4_ = 0x80000000;
    }
    uVar4 = vcmpss_avx512f(auVar8,auVar20,1);
    bVar9 = (bool)((byte)uVar4 & 1);
    uVar4 = vmovlps_avx(auVar12);
    (this->shading).n.super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)uVar4;
    (this->shading).n.super_Tuple3<pbrt::Normal3,_float>.y = (float)(int)((ulong)uVar4 >> 0x20);
    (this->shading).n.super_Tuple3<pbrt::Normal3,_float>.z =
         (float)((uint)bVar9 * (int)-fVar1 + (uint)!bVar9 * (int)fVar1);
  }
  else {
    uVar5._0_4_ = (this->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.x;
    uVar5._4_4_ = (this->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.y;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = uVar5;
    fVar1 = (this->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.z;
    fVar2 = (this->shading).n.super_Tuple3<pbrt::Normal3,_float>.z;
    auVar8 = vmovshdup_avx(auVar11);
    auVar20 = ZEXT416((uint)(fVar2 * fVar1));
    auVar8 = vfmadd132ss_fma(auVar8,auVar20,
                             ZEXT416((uint)(this->shading).n.super_Tuple3<pbrt::Normal3,_float>.y));
    auVar20 = vfmsub213ss_fma(ZEXT416((uint)fVar2),ZEXT416((uint)fVar1),auVar20);
    auVar8 = vfmadd132ss_fma(auVar11,ZEXT416((uint)(auVar8._0_4_ + auVar20._0_4_)),
                             ZEXT416((uint)(this->shading).n.super_Tuple3<pbrt::Normal3,_float>.x));
    auVar21._0_12_ = ZEXT812(0);
    auVar21._12_4_ = 0;
    if (auVar8._0_4_ < 0.0) {
      auVar11._0_8_ = uVar5 ^ 0x8000000080000000;
      auVar11._8_4_ = 0x80000000;
      auVar11._12_4_ = 0x80000000;
    }
    uVar4 = vcmpss_avx512f(auVar8,auVar21,1);
    bVar9 = (bool)((byte)uVar4 & 1);
    uVar4 = vmovlps_avx(auVar11);
    (this->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)uVar4;
    (this->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.y =
         (float)(int)((ulong)uVar4 >> 0x20);
    (this->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.z =
         (float)((uint)bVar9 * (int)-fVar1 + (uint)!bVar9 * (int)fVar1);
  }
  uVar4 = vmovlps_avx(auVar14._0_16_);
  (this->shading).dpdu.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar4;
  (this->shading).dpdu.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)uVar4 >> 0x20);
  (this->shading).dpdu.super_Tuple3<pbrt::Vector3,_float>.z =
       dpdus.super_Tuple3<pbrt::Vector3,_float>.z;
  uVar4 = vmovlps_avx(auVar17._0_16_);
  (this->shading).dpdv.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar4;
  (this->shading).dpdv.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)uVar4 >> 0x20);
  (this->shading).dpdv.super_Tuple3<pbrt::Vector3,_float>.z =
       dpdvs.super_Tuple3<pbrt::Vector3,_float>.z;
  uVar4 = vmovlps_avx(auVar19._0_16_);
  (this->shading).dndu.super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)uVar4;
  (this->shading).dndu.super_Tuple3<pbrt::Normal3,_float>.y = (float)(int)((ulong)uVar4 >> 0x20);
  (this->shading).dndu.super_Tuple3<pbrt::Normal3,_float>.z =
       dndus.super_Tuple3<pbrt::Normal3,_float>.z;
  (this->shading).dndv.super_Tuple3<pbrt::Normal3,_float>.x =
       dndvs.super_Tuple3<pbrt::Normal3,_float>.x;
  (this->shading).dndv.super_Tuple3<pbrt::Normal3,_float>.y =
       dndvs.super_Tuple3<pbrt::Normal3,_float>.y;
  (this->shading).dndv.super_Tuple3<pbrt::Normal3,_float>.z =
       dndvs.super_Tuple3<pbrt::Normal3,_float>.z;
  auVar8._0_12_ = *(undefined1 (*) [12])&(this->shading).dpdu;
  auVar8._12_4_ = (this->shading).dpdv.super_Tuple3<pbrt::Vector3,_float>.x;
  uVar3 = (this->shading).dpdv.super_Tuple3<pbrt::Vector3,_float>.y;
  uVar7 = (this->shading).dpdv.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar13._4_4_ = uVar7;
  auVar13._0_4_ = uVar3;
  auVar13._8_8_ = 0;
  auVar15._8_4_ = 0x4cbebc20;
  auVar15._0_8_ = 0x4cbebc204cbebc20;
  auVar15._12_4_ = 0x4cbebc20;
  do {
    auVar16._0_4_ = auVar8._0_4_ * auVar8._0_4_;
    auVar16._4_4_ = auVar8._4_4_ * auVar8._4_4_;
    auVar16._8_4_ = auVar8._8_4_ * auVar8._8_4_;
    auVar16._12_4_ = auVar8._12_4_ * auVar8._12_4_;
    auVar20 = vhaddps_avx(auVar16,auVar16);
    auVar12 = vshufpd_avx(auVar16,auVar16,1);
    if (auVar20._0_4_ + auVar12._0_4_ <= 1e+16) {
      auVar12 = vshufps_avx(auVar16,auVar16,0xff);
      auVar18._0_4_ = auVar13._0_4_ * auVar13._0_4_;
      auVar18._4_4_ = auVar13._4_4_ * auVar13._4_4_;
      auVar18._8_4_ = auVar13._8_4_ * auVar13._8_4_;
      auVar18._12_4_ = auVar13._12_4_ * auVar13._12_4_;
      auVar20 = vmovshdup_avx(auVar18);
      if (auVar12._0_4_ + auVar18._0_4_ + auVar20._0_4_ <= 1e+16) {
        return;
      }
    }
    auVar8 = vdivps_avx(auVar8,auVar15);
    (this->shading).dpdu = (Vector3f)auVar8._0_12_;
    (this->shading).dpdv.super_Tuple3<pbrt::Vector3,_float>.x = (float)auVar8._12_4_;
    auVar13 = vdivps_avx(auVar13,auVar15);
    uVar4 = vmovlps_avx(auVar13);
    (this->shading).dpdv.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)uVar4;
    (this->shading).dpdv.super_Tuple3<pbrt::Vector3,_float>.z = (float)(int)((ulong)uVar4 >> 0x20);
  } while( true );
}

Assistant:

PBRT_CPU_GPU
    void SetShadingGeometry(Normal3f ns, Vector3f dpdus, Vector3f dpdvs, Normal3f dndus,
                            Normal3f dndvs, bool orientationIsAuthoritative) {
        // Compute _shading.n_ for _SurfaceInteraction_
        shading.n = ns;
        DCHECK_NE(shading.n, Normal3f(0, 0, 0));
        if (orientationIsAuthoritative)
            n = FaceForward(n, shading.n);
        else
            shading.n = FaceForward(shading.n, n);

        // Initialize _shading_ partial derivative values
        shading.dpdu = dpdus;
        shading.dpdv = dpdvs;
        shading.dndu = dndus;
        shading.dndv = dndvs;
        while (LengthSquared(shading.dpdu) > 1e16f ||
               LengthSquared(shading.dpdv) > 1e16f) {
            shading.dpdu /= 1e8f;
            shading.dpdv /= 1e8f;
        }
    }